

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O1

Test * __thiscall
testing::internal::ParameterizedTestFactory<InternalFixupSectionNames_SectionName_Test>::CreateTest
          (ParameterizedTestFactory<InternalFixupSectionNames_SectionName_Test> *this)

{
  InternalFixupMembersImport *this_00;
  
  WithParamInterface<std::tuple<char_const*,pstore::repo::section_kind>>::parameter_ =
       &this->parameter_;
  this_00 = (InternalFixupMembersImport *)operator_new(0x158);
  anon_unknown.dwarf_437d0d::InternalFixupMembersImport::InternalFixupMembersImport(this_00);
  (this_00->super_Test)._vptr_Test = (_func_int **)&PTR__InternalFixupSectionNames_00240d40;
  this_00[1].super_Test._vptr_Test =
       (_func_int **)&PTR__InternalFixupSectionNames_SectionName_Test_00240d80;
  return &this_00->super_Test;
}

Assistant:

Test* CreateTest() override {
    TestClass::SetParam(&parameter_);
    return new TestClass();
  }